

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_4fPoint::Normalize(ON_4fPoint *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  uint uVar4;
  double dVar5;
  double local_28 [4];
  
  uVar4 = MaximumCoordinateIndex(this);
  uVar1._0_4_ = this->x;
  uVar1._4_4_ = this->y;
  local_28[0] = (double)(float)(uVar1 & 0x7fffffff7fffffff);
  local_28[1] = (double)(float)((uVar1 & 0x7fffffff7fffffff) >> 0x20);
  uVar2._0_4_ = this->z;
  uVar2._4_4_ = this->w;
  local_28[2] = (double)(float)(uVar2 & 0x7fffffff7fffffff);
  local_28[3] = (double)(float)((uVar2 & 0x7fffffff7fffffff) >> 0x20);
  dVar3 = local_28[uVar4];
  if (0.0 < dVar3) {
    dVar5 = 1.0 / dVar3;
    local_28[0] = local_28[0] * dVar5;
    local_28[1] = local_28[1] * dVar5;
    local_28[2] = dVar5 * local_28[2];
    local_28[3] = dVar5 * local_28[3];
    local_28[uVar4] = 1.0;
    dVar5 = 1.0 / (SQRT(local_28[3] * local_28[3] +
                        local_28[2] * local_28[2] +
                        local_28[0] * local_28[0] + local_28[1] * local_28[1]) * dVar3);
    this->x = (float)((double)(float)(undefined4)uVar1 * dVar5);
    this->y = (float)((double)(float)uVar1._4_4_ * dVar5);
    this->z = (float)(dVar5 * (double)(float)(undefined4)uVar2);
    this->w = (float)(dVar5 * (double)(float)uVar2._4_4_);
  }
  return 0.0 < dVar3;
}

Assistant:

bool ON_4fPoint::Normalize()
{
  bool rc = false;
  const int i = MaximumCoordinateIndex();
  double f[4];
  f[0] = fabs(x);
  f[1] = fabs(y);
  f[2] = fabs(z);
  f[3] = fabs(w);
  const double c = f[i];
  if ( c > 0.0 ) {
    double len = 1.0/c;
    f[0] *= len;
    f[1] *= len;
    f[2] *= len;
    f[3] *= len;
    f[i] = 1.0;
		// GBA 7/1/04.  Fixed typo
    const double s = 1.0/(c*sqrt(f[0]*f[0] + f[1]*f[1] + f[2]*f[2] + f[3]*f[3]));
    x = (float)(s*x);
    y = (float)(s*y);
    z = (float)(s*z);
    w = (float)(s*w);
    rc = true;
  }
  return rc;
}